

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  Instruction *pIVar1;
  ravi_type_map rVar2;
  int iVar3;
  uint uVar4;
  Value *v;
  OpCode o;
  TString *usertype;
  Value local_50;
  undefined2 local_48;
  Value local_40;
  undefined2 local_38;
  
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
  case VFALSE:
    uVar4 = (uint)(e->k == VTRUE);
    o = OP_LOADBOOL;
LAB_001458b5:
    luaK_codeABC(fs,o,reg,uVar4,0);
    break;
  case VK:
    iVar3 = (e->u).info;
    goto LAB_001459e3;
  case VKFLT:
    local_50 = (Value)(e->u).ival;
    v = &local_50;
    local_48 = 3;
    goto LAB_001459d7;
  case VKINT:
    local_50 = (Value)(e->u).ival;
    local_48 = 2;
    v = &local_40;
    local_38 = 0x13;
    local_40 = local_50;
LAB_001459d7:
    iVar3 = addk(fs,(TValue *)&local_50,(TValue *)v);
LAB_001459e3:
    luaK_codek(fs,reg,iVar3);
    break;
  case VNONRELOC:
    if ((e->u).info != reg) {
      local_50.gc = (GCObject *)0x0;
      rVar2 = raviY_get_register_typeinfo(fs,reg,(TString **)&local_50.gc);
      uVar4 = (e->u).info;
      if ((int)rVar2 < 0x20) {
        if (rVar2 == 8) {
          o = OP_RAVI_MOVEI;
        }
        else if (rVar2 == 0x10) {
          o = OP_RAVI_MOVEF;
        }
        else {
LAB_00145a40:
          luaK_codeABC(fs,OP_MOVE,reg,uVar4,0);
          if (rVar2 == 0x201) {
            o = OP_RAVI_TOCLOSURE;
          }
          else {
            if (rVar2 != 0x101) {
              if ((TString *)local_50.gc != (TString *)0x0 && rVar2 == 0x401) {
                uVar4 = luaK_stringK(fs,(TString *)local_50.gc);
                luaK_codeABx(fs,OP_RAVI_TOTYPE,reg,uVar4);
              }
              break;
            }
            o = OP_RAVI_TOSTRING;
          }
          uVar4 = 0;
        }
      }
      else if (rVar2 == 0x20) {
        o = OP_RAVI_MOVEIARRAY;
      }
      else if (rVar2 == 0x40) {
        o = OP_RAVI_MOVEFARRAY;
      }
      else {
        if (rVar2 != 0x80) goto LAB_00145a40;
        o = OP_RAVI_MOVETAB;
      }
      goto LAB_001458b5;
    }
    break;
  default:
    __assert_fail("e->k == VJMP",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x2cb,"void discharge2reg(FuncState *, expdesc *, int)");
  case VJMP:
    goto switchD_001458a1_caseD_b;
  case VRELOCABLE:
    pIVar1 = fs->f->code;
    iVar3 = (e->u).info;
    *(byte *)((long)pIVar1 + (long)iVar3 * 4 + 1) = (byte)reg & 0x7f;
    if (((byte)ravi_parser_debug & 1) != 0) {
      raviY_printf(fs,"discharge2reg (VRELOCABLE set arg A) %e\n",e);
    }
    if (((byte)ravi_parser_debug & 2) != 0) {
      raviY_printf(fs,"[%d]* %o ; set A to %d\n",(ulong)(uint)(e->u).info,(ulong)pIVar1[iVar3],
                   (ulong)(uint)reg);
    }
  }
  (e->u).info = reg;
  e->k = VNONRELOC;
switchD_001458a1_caseD_b:
  return;
}

Assistant:

static void discharge2reg (FuncState *fs, expdesc *e, int reg) {
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VNIL: {
      luaK_nil(fs, reg, 1);
      break;
    }
    case VFALSE: case VTRUE: {
      luaK_codeABC(fs, OP_LOADBOOL, reg, e->k == VTRUE, 0);
      break;
    }
    case VK: {
      luaK_codek(fs, reg, e->u.info);
      break;
    }
    case VKFLT: {
      luaK_codek(fs, reg, luaK_numberK(fs, e->u.nval));
      break;
    }
    case VKINT: {
      luaK_codek(fs, reg, luaK_intK(fs, e->u.ival));
      break;
    }
    case VRELOCABLE: {
      Instruction *pc = &getinstruction(fs, e);
      SETARG_A(*pc, reg);  /* instruction will put result in 'reg' */
      DEBUG_EXPR(raviY_printf(fs, "discharge2reg (VRELOCABLE set arg A) %e\n", e));
      DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", e->u.info, *pc, reg));
      break;
    }
    case VNONRELOC: {
      if (reg != e->u.info) {
        /* code a MOVEI or MOVEF if the target register is a local typed variable */
        TString *usertype = NULL;
        int ravi_type = raviY_get_register_typeinfo(fs, reg, &usertype);
        switch (ravi_type) {
        case RAVI_TM_INTEGER:
          luaK_codeABC(fs, OP_RAVI_MOVEI, reg, e->u.info, 0);
          break;
        case RAVI_TM_FLOAT:
          luaK_codeABC(fs, OP_RAVI_MOVEF, reg, e->u.info, 0);
          break;
        case RAVI_TM_INTEGER_ARRAY:
          luaK_codeABC(fs, OP_RAVI_MOVEIARRAY, reg, e->u.info, 0);
          break;
        case RAVI_TM_FLOAT_ARRAY:
          luaK_codeABC(fs, OP_RAVI_MOVEFARRAY, reg, e->u.info, 0);
          break;
        case RAVI_TM_TABLE:
          luaK_codeABC(fs, OP_RAVI_MOVETAB, reg, e->u.info, 0);
          break;
        default:
          luaK_codeABC(fs, OP_MOVE, reg, e->u.info, 0);
          if (ravi_type == RAVI_TM_STRING_OR_NIL)
            luaK_codeABC(fs, OP_RAVI_TOSTRING, reg, 0, 0);
          else if (ravi_type == RAVI_TM_FUNCTION_OR_NIL)
            luaK_codeABC(fs, OP_RAVI_TOCLOSURE, reg, 0, 0);
          else if (ravi_type == RAVI_TM_USERDATA_OR_NIL && usertype)
            luaK_codeABx(fs, OP_RAVI_TOTYPE, reg, luaK_stringK(fs, usertype));
          break;
        }
      }
      break;
    }
    default: {
      lua_assert(e->k == VJMP);
      return;  /* nothing to do... */
    }
  }
  e->u.info = reg;
  e->k = VNONRELOC;
}